

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cpp
# Opt level: O1

void check_locale(char **names)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  char **ppcVar4;
  char *__s;
  locale l;
  locale local_38 [8];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"locale",6);
  *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"C",1);
  *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"C++",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  __s = *names;
  if (__s != (char *)0x0) {
    ppcVar4 = names + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 0x20;
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
      *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 4;
      pcVar2 = setlocale(6,__s);
      if (pcVar2 == (char *)0x0) {
        lVar3 = 2;
        pcVar2 = "No";
      }
      else {
        lVar3 = 3;
        pcVar2 = "Yes";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar3);
      *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 4;
      std::locale::locale(local_38,__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Yes",3);
      std::locale::~locale(local_38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      __s = *ppcVar4;
      ppcVar4 = ppcVar4 + 1;
    } while (__s != (char *)0x0);
  }
  return;
}

Assistant:

void check_locale(char const **names)
{
    std::cout << "  " << std::setw(32) << "locale" << std::setw(4) << "C" << std::setw(4) << "C++" << std::endl;
    while(*names) {
        char const *name = *names;
        std::cout << "  " << std::setw(32) << name << std::setw(4);
        if(setlocale(LC_ALL,name)!=0)
            std::cout << "Yes";
        else
            std::cout << "No";
        std::cout << std::setw(4);
        try {
            std::locale l(name);
            std::cout << "Yes";
        }
        catch(std::exception const &) {
            std::cout << "No";
        }
        std::cout << std::endl;
        names++;
    }
}